

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.cpp
# Opt level: O2

void __thiscall chatra::Scope::Scope(Scope *this,Storage *storage,ScopeType type)

{
  AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
  ::AsyncRead(&this->
               super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
             );
  this->storage = storage;
  this->type = type;
  (this->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nextId = 0xfffffffe;
  this->lockAllocateCapture = (atomic_flag)0x0;
  this->captured = (__atomic_base<bool>)0x0;
  SpinLock::lock(&storage->lockScopes);
  std::
  _Hashtable<chatra::Scope*,chatra::Scope*,std::allocator<chatra::Scope*>,std::__detail::_Identity,std::equal_to<chatra::Scope*>,std::hash<chatra::Scope*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<chatra::Scope*>
            ((_Hashtable<chatra::Scope*,chatra::Scope*,std::allocator<chatra::Scope*>,std::__detail::_Identity,std::equal_to<chatra::Scope*>,std::hash<chatra::Scope*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&storage->scopes);
  add(this,CapturedScope,0xffffffffffffffff);
  (storage->lockScopes).flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

Scope::Scope(Storage& storage, ScopeType type) noexcept : storage(storage), type(type) {
	std::lock_guard<SpinLock> lock(storage.lockScopes);
	storage.scopes.emplace(this);
	add(StringId::CapturedScope, InvalidRequester);
}